

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setAttribute
          (GLShaderProgram *this,string *name,vector<int,_std::allocator<int>_> *data,bool update,
          int offset,int size)

{
  pointer piVar1;
  pointer piVar2;
  pointer pGVar3;
  size_t sVar4;
  size_t __n;
  int iVar5;
  invalid_argument *piVar6;
  long *plVar7;
  size_type *psVar8;
  ulong uVar9;
  pointer pGVar10;
  ulong uVar11;
  bool bVar12;
  vector<int,_std::allocator<int>_> intData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<int,_std::allocator<int>_> local_c8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&local_c8,
             (long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_128);
  piVar1 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar11 = (long)piVar2 - (long)piVar1 >> 2;
  if (piVar2 != piVar1) {
    uVar9 = 0;
    do {
      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar9] = piVar1[uVar9];
      uVar9 = uVar9 + 1;
    } while ((uVar9 & 0xffffffff) < uVar11);
  }
  pGVar10 = (this->attributes).
            super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pGVar3 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pGVar10 != pGVar3) {
    sVar4 = name->_M_string_length;
    do {
      __n = (pGVar10->name)._M_string_length;
      if (__n == sVar4) {
        if (__n == 0) {
          bVar12 = true;
        }
        else {
          iVar5 = bcmp((pGVar10->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n);
          bVar12 = iVar5 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      if (bVar12) {
        if (pGVar10->type != Int) {
          piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+(&local_70,"Tried to set GLShaderAttribute named ",name);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
          local_108._M_dataplus._M_p = (pointer)*plVar7;
          psVar8 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_108._M_dataplus._M_p == psVar8) {
            local_108.field_2._M_allocated_capacity = *psVar8;
            local_108.field_2._8_8_ = plVar7[3];
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          }
          else {
            local_108.field_2._M_allocated_capacity = *psVar8;
          }
          local_108._M_string_length = plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::to_string(&local_90,pGVar10->type);
          std::operator+(&local_50,&local_108,&local_90);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_e8._M_dataplus._M_p = (pointer)*plVar7;
          psVar8 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_e8._M_dataplus._M_p == psVar8) {
            local_e8.field_2._M_allocated_capacity = *psVar8;
            local_e8.field_2._8_8_ = plVar7[3];
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar8;
          }
          local_e8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::to_string(&local_b0,5);
          std::operator+(&local_128,&local_e8,&local_b0);
          std::invalid_argument::invalid_argument(piVar6,(string *)&local_128);
          __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        if (update) {
          if (size == -1) {
            size = (int)pGVar10->dataSize;
          }
          size = size << 2;
        }
        else {
          pGVar10->dataSize = uVar11;
        }
      }
      if (bVar12) {
        if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return;
      }
      pGVar10 = pGVar10 + 1;
    } while (pGVar10 != pGVar3);
  }
  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_128,"No attribute with name ",name);
  std::invalid_argument::invalid_argument(piVar6,(string *)&local_128);
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::setAttribute(std::string name, const std::vector<int>& data, bool update, int offset, int size) {
  // FIXME I've seen strange bugs when using int's in shaders. Need to figure
  // out it it's my shaders or something wrong with this function

  // Convert data to GL_INT (probably does nothing)
  std::vector<int> intData(data.size());
  for (unsigned int i = 0; i < data.size(); i++) {
    intData[i] = static_cast<int>(data[i]);
  }

  for (GLShaderAttribute& a : attributes) {
    if (a.name == name) {
      if (a.type == DataType::Int) {
        if (update) {
          // TODO: Allow modifications to non-contiguous memory
          offset *= sizeof(int);
          if (size == -1)
            size = a.dataSize * sizeof(int);
          else
            size *= sizeof(int);

        } else {
          a.dataSize = data.size();
        }
      } else {
        throw std::invalid_argument("Tried to set GLShaderAttribute named " + name +
                                    " with wrong type. Actual type: " + std::to_string(static_cast<int>(a.type)) +
                                    "  Attempted type: " + std::to_string(static_cast<int>(DataType::Int)));
      }
      return;
    }
  }

  throw std::invalid_argument("No attribute with name " + name);
}